

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_TextObject::Transform(ON_OBSOLETE_V5_TextObject *this,ON_Xform *xform)

{
  bool bVar1;
  long lVar2;
  ON_Plane *pOVar3;
  ON_Plane *pOVar4;
  ON_Plane *p;
  byte bVar5;
  double dVar6;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_Plane xformed_plane;
  ON_3dPoint local_100;
  ON_3dPoint local_e8;
  ON_3dPoint local_d0;
  ON_3dPoint local_b8;
  ON_Plane local_a0;
  
  bVar5 = 0;
  bVar1 = ON_Xform::IsIdentity(xform,0.0);
  if (!bVar1) {
    p = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
    pOVar3 = p;
    pOVar4 = &local_a0;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pOVar4->origin).x = (pOVar3->origin).x;
      pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar5 * -0x10 + 8);
      pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    bVar1 = ON_Plane::Transform(&local_a0,xform);
    if ((bVar1) && (bVar1 = ON_Geometry::Transform((ON_Geometry *)this,xform), bVar1)) {
      ON_Xform::operator*(&local_d0,xform,&p->origin);
      ON_3dPoint::operator+
                (&local_100,&p->origin,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis);
      ON_Xform::operator*(&local_e8,xform,&local_100);
      dVar6 = ON_3dPoint::DistanceTo(&local_d0,&local_e8);
      if (dVar6 <= 2.3283064365386963e-10) {
        ON_3dPoint::operator+
                  (&local_b8,&p->origin,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis);
        ON_Xform::operator*(&local_100,xform,&local_b8);
        local_e8.z = local_100.z;
        local_e8.x = local_100.x;
        local_e8.y = local_100.y;
        dVar6 = ON_3dPoint::DistanceTo(&local_d0,&local_e8);
      }
      pOVar3 = &local_a0;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        (p->origin).x = (pOVar3->origin).x;
        pOVar3 = (ON_Plane *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
        p = (ON_Plane *)((long)p + (ulong)bVar5 * -0x10 + 8);
      }
      if (((2.3283064365386963e-10 < dVar6) && (1.490116119385e-08 < ABS(dVar6 + -1.0))) &&
         (dVar6 = dVar6 * (this->super_ON_OBSOLETE_V5_Annotation).m_textheight,
         1.490116119385e-08 < dVar6)) {
        (this->super_ON_OBSOLETE_V5_Annotation).m_textheight = dVar6;
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    ON_Plane::~ON_Plane(&local_a0);
    return bVar1;
  }
  return true;
}

Assistant:

bool ON_OBSOLETE_V5_TextObject::Transform( const ON_Xform& xform )
{
  // Dale Lear - this override fixes RR 11114 by correctly
  //             handling non uniform scaling.
  bool rc = xform.IsIdentity();
  if ( !rc)
  {
    ON_Plane xformed_plane = m_plane;
    rc = xformed_plane.Transform(xform);
    if (rc)
    rc = ON_Geometry::Transform(xform)?true:false;
    if (rc)
    {
      ON_3dPoint P0 = xform*m_plane.origin;
      ON_3dPoint P1 = xform*(m_plane.origin + m_plane.xaxis);
      double s = P0.DistanceTo(P1);
      if ( s <= ON_ZERO_TOLERANCE )
      {
        P1 = xform*(m_plane.origin + m_plane.yaxis);
        s = P0.DistanceTo(P1);
      }
      m_plane = xformed_plane;
      if ( s > ON_ZERO_TOLERANCE && fabs(s-1.0) > ON_SQRT_EPSILON )
      {
        s *= m_textheight;
        if ( s > ON_SQRT_EPSILON )
          m_textheight = s;
      }
    }
  }

  return rc;
}